

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O1

UBool icu_63::enumNames(UCharNames *names,UChar32 start,UChar32 limit,UEnumCharNamesFn *fn,
                       void *context,UCharNameChoice nameChoice)

{
  ushort uVar1;
  bool bVar2;
  UBool UVar3;
  uint end;
  ushort *group;
  ushort *puVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ushort *puVar8;
  uint start_00;
  ushort local_3c;
  
  group = getGroup(names,start);
  uVar7 = (uint)start >> 5 & 0xffff;
  start_00 = start;
  if (nameChoice == U_EXTENDED_CHAR_NAME && uVar7 < *group) {
    start_00 = (uint)*group * 0x20;
    if (limit <= (int)start_00) {
      start_00 = limit;
    }
    UVar3 = enumExtNames(start,start_00 - 1,fn,context);
    if (UVar3 == '\0') {
      return '\0';
    }
  }
  end = limit - 1;
  uVar5 = end >> 5 & 0xffff;
  if (uVar7 == uVar5) {
    if (*group == (uint16_t)((uint)start >> 5)) {
      UVar3 = enumGroupNames(names,group,start_00,end,fn,context,nameChoice);
      return UVar3;
    }
    goto LAB_002f3832;
  }
  puVar8 = (ushort *)
           ((long)&names->tokenStringOffset +
           (ulong)*(ushort *)((long)&names->tokenStringOffset + (ulong)names->groupsOffset) * 6 +
           (ulong)names->groupsOffset + 2);
  if (uVar7 == *group) {
    if ((start_00 & 0x1f) != 0) {
      UVar3 = enumGroupNames(names,group,start_00,uVar7 << 5 | 0x1f,fn,context,nameChoice);
      if (UVar3 == '\0') goto LAB_002f37d2;
      group = group + 3;
    }
LAB_002f372c:
    do {
      if (puVar8 <= group) {
LAB_002f3804:
        bVar2 = false;
        UVar3 = '\x01';
        if ((nameChoice == U_EXTENDED_CHAR_NAME) && (group == puVar8)) {
          uVar7 = (uint)group[-3] * 0x20 + 0x20;
          if ((int)uVar7 <= (int)start_00) {
            uVar7 = start_00;
          }
          start_00 = uVar7;
          bVar2 = true;
          UVar3 = '\0';
        }
        goto LAB_002f382e;
      }
      uVar1 = *group;
      if (uVar5 <= uVar1) {
        local_3c = (ushort)(end >> 5);
        if (uVar1 != local_3c) goto LAB_002f3804;
        UVar3 = enumGroupNames(names,group,end & 0xffffffe0,end,fn,context,nameChoice);
        bVar2 = false;
        goto LAB_002f382e;
      }
      start_00 = (uint)uVar1 * 0x20;
      UVar3 = enumGroupNames(names,group,start_00,start_00 + 0x1f,fn,context,nameChoice);
      if (UVar3 == '\0') {
LAB_002f37bb:
        bVar2 = false;
      }
      else {
        if ((group + 3 < puVar8) && (nameChoice == U_EXTENDED_CHAR_NAME)) {
          if (*group + 1 < (uint)group[3]) {
            iVar6 = (uint)group[3] << 5;
            if (limit <= iVar6) {
              iVar6 = limit;
            }
            UVar3 = enumExtNames((uint)*group * 0x20 + 0x20,iVar6 + -1,fn,context);
            if (UVar3 == '\0') goto LAB_002f37bb;
          }
        }
        bVar2 = true;
        group = group + 3;
      }
    } while (bVar2);
  }
  else {
    if (uVar7 <= *group) goto LAB_002f372c;
    puVar4 = group + 3;
    if ((puVar4 < puVar8) && (uVar7 < *puVar4 && nameChoice == U_EXTENDED_CHAR_NAME)) {
      iVar6 = (uint)*puVar4 << 5;
      if (limit <= iVar6) {
        iVar6 = limit;
      }
      UVar3 = enumExtNames(start_00,iVar6 + -1,fn,context);
      if (UVar3 != '\0') goto LAB_002f370b;
      bVar2 = false;
    }
    else {
LAB_002f370b:
      bVar2 = true;
      group = puVar4;
    }
    if (bVar2) goto LAB_002f372c;
  }
LAB_002f37d2:
  bVar2 = false;
  UVar3 = '\0';
LAB_002f382e:
  if (!bVar2) {
    return UVar3;
  }
LAB_002f3832:
  if (nameChoice != U_EXTENDED_CHAR_NAME) {
    return '\x01';
  }
  iVar6 = 0x110000;
  if (limit < 0x110000) {
    iVar6 = limit;
  }
  UVar3 = enumExtNames(start_00,iVar6 + -1,fn,context);
  return UVar3;
}

Assistant:

static UBool
enumNames(UCharNames *names,
          UChar32 start, UChar32 limit,
          UEnumCharNamesFn *fn, void *context,
          UCharNameChoice nameChoice) {
    uint16_t startGroupMSB, endGroupMSB, groupCount;
    const uint16_t *group, *groupLimit;

    startGroupMSB=(uint16_t)(start>>GROUP_SHIFT);
    endGroupMSB=(uint16_t)((limit-1)>>GROUP_SHIFT);

    /* find the group that contains start, or the highest before it */
    group=getGroup(names, start);

    if(startGroupMSB<group[GROUP_MSB] && nameChoice==U_EXTENDED_CHAR_NAME) {
        /* enumerate synthetic names between start and the group start */
        UChar32 extLimit=((UChar32)group[GROUP_MSB]<<GROUP_SHIFT);
        if(extLimit>limit) {
            extLimit=limit;
        }
        if(!enumExtNames(start, extLimit-1, fn, context)) {
            return FALSE;
        }
        start=extLimit;
    }

    if(startGroupMSB==endGroupMSB) {
        if(startGroupMSB==group[GROUP_MSB]) {
            /* if start and limit-1 are in the same group, then enumerate only in that one */
            return enumGroupNames(names, group, start, limit-1, fn, context, nameChoice);
        }
    } else {
        const uint16_t *groups=GET_GROUPS(names);
        groupCount=*groups++;
        groupLimit=groups+groupCount*GROUP_LENGTH;

        if(startGroupMSB==group[GROUP_MSB]) {
            /* enumerate characters in the partial start group */
            if((start&GROUP_MASK)!=0) {
                if(!enumGroupNames(names, group,
                                   start, ((UChar32)startGroupMSB<<GROUP_SHIFT)+LINES_PER_GROUP-1,
                                   fn, context, nameChoice)) {
                    return FALSE;
                }
                group=NEXT_GROUP(group); /* continue with the next group */
            }
        } else if(startGroupMSB>group[GROUP_MSB]) {
            /* make sure that we start enumerating with the first group after start */
            const uint16_t *nextGroup=NEXT_GROUP(group);
            if (nextGroup < groupLimit && nextGroup[GROUP_MSB] > startGroupMSB && nameChoice == U_EXTENDED_CHAR_NAME) {
                UChar32 end = nextGroup[GROUP_MSB] << GROUP_SHIFT;
                if (end > limit) {
                    end = limit;
                }
                if (!enumExtNames(start, end - 1, fn, context)) {
                    return FALSE;
                }
            }
            group=nextGroup;
        }

        /* enumerate entire groups between the start- and end-groups */
        while(group<groupLimit && group[GROUP_MSB]<endGroupMSB) {
            const uint16_t *nextGroup;
            start=(UChar32)group[GROUP_MSB]<<GROUP_SHIFT;
            if(!enumGroupNames(names, group, start, start+LINES_PER_GROUP-1, fn, context, nameChoice)) {
                return FALSE;
            }
            nextGroup=NEXT_GROUP(group);
            if (nextGroup < groupLimit && nextGroup[GROUP_MSB] > group[GROUP_MSB] + 1 && nameChoice == U_EXTENDED_CHAR_NAME) {
                UChar32 end = nextGroup[GROUP_MSB] << GROUP_SHIFT;
                if (end > limit) {
                    end = limit;
                }
                if (!enumExtNames((group[GROUP_MSB] + 1) << GROUP_SHIFT, end - 1, fn, context)) {
                    return FALSE;
                }
            }
            group=nextGroup;
        }

        /* enumerate within the end group (group[GROUP_MSB]==endGroupMSB) */
        if(group<groupLimit && group[GROUP_MSB]==endGroupMSB) {
            return enumGroupNames(names, group, (limit-1)&~GROUP_MASK, limit-1, fn, context, nameChoice);
        } else if (nameChoice == U_EXTENDED_CHAR_NAME && group == groupLimit) {
            UChar32 next = (PREV_GROUP(group)[GROUP_MSB] + 1) << GROUP_SHIFT;
            if (next > start) {
                start = next;
            }
        } else {
            return TRUE;
        }
    }

    /* we have not found a group, which means everything is made of
       extended names. */
    if (nameChoice == U_EXTENDED_CHAR_NAME) {
        if (limit > UCHAR_MAX_VALUE + 1) {
            limit = UCHAR_MAX_VALUE + 1;
        }
        return enumExtNames(start, limit - 1, fn, context);
    }
    
    return TRUE;
}